

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 target,U32 mls,int extDict)

{
  BYTE *pBVar1;
  U32 UVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  uint *puVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  U32 UVar17;
  ulong uVar18;
  int iVar19;
  BYTE *pBVar20;
  bool bVar21;
  uint local_bc;
  uint *local_b8;
  ulong local_90;
  U32 dummy32;
  ulong local_70;
  ulong local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  U32 *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar13 = (ms->cParams).hashLog;
  if (0x20 < uVar13) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  pUVar3 = ms->hashTable;
  switch(mls) {
  case 5:
    lVar5 = -0x30e4432345000000;
    goto LAB_001d3b89;
  case 6:
    uVar6 = ZSTD_hash6Ptr(ip,uVar13);
    break;
  case 7:
    lVar5 = -0x30e44323405a9d00;
LAB_001d3b89:
    uVar6 = (ulong)(lVar5 * *(long *)ip) >> (-(char)uVar13 & 0x3fU);
    break;
  case 8:
    uVar6 = ZSTD_hash8Ptr(ip,uVar13);
    break;
  default:
    uVar6 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar13 & 0x1fU));
  }
  uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  pBVar4 = (ms->window).base;
  uVar16 = (int)ip - (int)pBVar4;
  uVar11 = (ulong)uVar16;
  uVar15 = uVar16 - uVar13;
  if (uVar16 < uVar13) {
    uVar15 = 0;
  }
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar2 = (ms->window).lowLimit;
  UVar17 = target - uVar14;
  if (target - UVar2 <= uVar14) {
    UVar17 = UVar2;
  }
  if (ms->loadedDictEnd != 0) {
    UVar17 = UVar2;
  }
  iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  local_70 = uVar11;
  if (target < uVar16) {
    __assert_fail("curr <= target",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8100,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8101,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  local_48 = ms->chainTable;
  uVar14 = pUVar3[uVar6];
  local_50 = (ms->window).dictBase;
  local_68 = (ulong)(ms->window).dictLimit;
  pUVar3[uVar6] = uVar16;
  if (UVar17 == 0) {
    __assert_fail("windowLow > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8104,
                  "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                 );
  }
  local_58 = local_50 + local_68;
  local_60 = pBVar4 + local_68;
  uVar6 = (ulong)((uVar16 & uVar13) * 2);
  local_b8 = local_48 + uVar6;
  puVar10 = local_48 + uVar6 + 1;
  local_bc = uVar16 + 9;
  local_90 = 8;
  uVar6 = 0;
  uVar8 = 0;
  do {
    uVar12 = (ulong)uVar14;
    bVar21 = iVar19 == 0;
    iVar19 = iVar19 + -1;
    if ((bVar21) || (uVar14 < UVar17)) goto LAB_001d3e44;
    uVar18 = uVar6;
    if (uVar8 < uVar6) {
      uVar18 = uVar8;
    }
    local_38 = uVar8;
    if ((uint)uVar11 <= uVar14) {
      __assert_fail("matchIndex < curr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8108,
                    "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                   );
    }
    local_40 = uVar6;
    if ((extDict == 0) || (local_68 <= uVar18 + uVar12)) {
      if (uVar18 + uVar12 < local_68) {
        __assert_fail("matchIndex+matchLength >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8120,
                      "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                     );
      }
      sVar7 = ZSTD_count(ip + uVar18,pBVar4 + uVar12 + uVar18,iend);
      uVar8 = sVar7 + uVar18;
      pBVar20 = pBVar4 + uVar12;
    }
    else {
      pBVar1 = local_50 + uVar12;
      sVar7 = ZSTD_count_2segments(ip + uVar18,pBVar1 + uVar18,iend,local_58,local_60);
      uVar8 = sVar7 + uVar18;
      uVar11 = local_70;
      pBVar20 = pBVar4 + uVar12;
      if (uVar8 + uVar12 < local_68) {
        pBVar20 = pBVar1;
      }
    }
    if ((local_90 < uVar8) && (local_90 = uVar8, local_bc - uVar14 < uVar8)) {
      local_bc = (int)uVar8 + uVar14;
    }
    if (ip + uVar8 == iend) goto LAB_001d3e44;
    puVar9 = local_48 + (uVar14 & uVar13) * 2;
    if (pBVar20[uVar8] < ip[uVar8]) {
      *local_b8 = uVar14;
      if (uVar14 <= uVar15) {
        local_b8 = &dummy32;
LAB_001d3e44:
        *puVar10 = 0;
        *local_b8 = 0;
        uVar13 = local_bc - (uVar16 + 8);
        if (local_bc < uVar16 + 8 || uVar13 == 0) {
          __assert_fail("matchEndIdx > curr + 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8147,
                        "U32 ZSTD_insertBt1(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const U32, const int)"
                       );
        }
        uVar16 = (int)local_90 - 0x180;
        uVar15 = 0xc0;
        if (uVar16 < 0xc0) {
          uVar15 = uVar16;
        }
        uVar16 = 0;
        if (0x180 < local_90) {
          uVar16 = uVar15;
        }
        if (uVar16 <= uVar13) {
          uVar16 = uVar13;
        }
        return uVar16;
      }
      puVar9 = puVar9 + 1;
      uVar6 = local_40;
      local_b8 = puVar9;
    }
    else {
      *puVar10 = uVar14;
      puVar10 = puVar9;
      uVar6 = uVar8;
      uVar8 = local_38;
      if (uVar14 <= uVar15) {
        puVar10 = &dummy32;
        goto LAB_001d3e44;
      }
    }
    uVar14 = *puVar9;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                const ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const target,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 curr = (U32)(ip-base);
    const U32 btLow = btMask >= curr ? 0 : curr - btMask;
    U32* smallerPtr = bt + 2*(curr&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    /* windowLow is based on target because
     * we only need positions that will be in the window at the end of the tree update.
     */
    U32 const windowLow = ZSTD_getLowestMatchIndex(ms, target, cParams->windowLog);
    U32 matchEndIdx = curr+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((curr-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((curr-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", curr);

    assert(curr <= target);
    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = curr;   /* Update Hash Table */

    assert(windowLow > 0);
    for (; nbCompares && (matchIndex >= windowLow); --nbCompares) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < curr);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    {   U32 positions = 0;
        if (bestLength > 384) positions = MIN(192, (U32)(bestLength - 384));   /* speed optimization */
        assert(matchEndIdx > curr + 8);
        return MAX(positions, matchEndIdx - (curr + 8));
    }
}